

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

void canvas_font(_glist *x,t_floatarg font,t_floatarg resize,t_floatarg whichresize)

{
  int iVar1;
  _glist *in_RAX;
  _glist *x_00;
  int *data;
  float fVar2;
  float fVar3;
  
  x_00 = canvas_getrootfor(in_RAX);
  iVar1 = x_00->gl_font;
  if ((resize != 0.0) || (NAN(resize))) {
    fVar2 = 20.0;
    if (20.0 <= resize) {
      fVar2 = resize;
    }
    fVar3 = 500.0;
    if (fVar2 <= 500.0) {
      fVar3 = fVar2;
    }
    fVar3 = fVar3 * 0.01;
  }
  else {
    fVar3 = 1.0;
  }
  canvas_dofont(x_00,font,
                (t_floatarg)
                (~-(uint)(whichresize != 3.0) & 0x3f800000 |
                -(uint)(whichresize != 3.0) & (uint)fVar3),
                (t_floatarg)
                (~-(uint)(whichresize != 2.0) & 0x3f800000 |
                -(uint)(whichresize != 2.0) & (uint)fVar3));
  data = (int *)getbytes(0xc);
  *data = iVar1;
  data[1] = (int)fVar3;
  data[2] = (int)whichresize;
  canvas_undo_add(x_00,UNDO_FONT,"font",data);
  sys_defaultfont = (int)font;
  return;
}

Assistant:

static void canvas_font(t_canvas *x, t_floatarg font, t_floatarg resize,
    t_floatarg whichresize)
{
    t_float realresize, realresx = 1, realresy = 1;
    t_canvas *x2 = canvas_getrootfor(x);
    int oldfont = x2->gl_font;
    if (!resize) realresize = 1;
    else
    {
        if (resize < 20) resize = 20;
        if (resize > 500) resize = 500;
        realresize = resize * 0.01;
    }
    if (whichresize != 3) realresx = realresize;
    if (whichresize != 2) realresy = realresize;
    canvas_dofont(x2, font, realresx, realresy);
    canvas_undo_add(x2, UNDO_FONT, "font",
        canvas_undo_set_font(x2, oldfont, realresize, whichresize));

    sys_defaultfont = font;
}